

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_control_mobile_impl.cc
# Opt level: O0

int __thiscall webrtc::EchoControlMobileImpl::Enable(EchoControlMobileImpl *this,bool enable)

{
  int sample_rate_hz;
  size_t num_reverse_channels;
  bool bVar1;
  ostream *poVar2;
  pointer pSVar3;
  unique_ptr<webrtc::EchoControlMobileImpl::StreamProperties,_std::default_delete<webrtc::EchoControlMobileImpl::StreamProperties>_>
  *this_00;
  FatalMessage local_1b8;
  FatalMessageVoidify local_3d [13];
  CritScope local_30;
  CritScope cs_capture;
  CritScope cs_render;
  bool enable_local;
  EchoControlMobileImpl *this_local;
  
  rtc::CritScope::CritScope(&cs_capture,this->crit_render_);
  rtc::CritScope::CritScope(&local_30,this->crit_capture_);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stream_properties_);
  if (!bVar1) {
    rtc::FatalMessageVoidify::FatalMessageVoidify(local_3d);
    rtc::FatalMessage::FatalMessage
              (&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/echo_control_mobile_impl.cc"
               ,0x104);
    poVar2 = rtc::FatalMessage::stream(&local_1b8);
    poVar2 = std::operator<<(poVar2,"Check failed: stream_properties_");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"# ");
    rtc::FatalMessageVoidify::operator&(local_3d,poVar2);
    rtc::FatalMessage::~FatalMessage(&local_1b8);
  }
  if ((enable) &&
     (pSVar3 = std::
               unique_ptr<webrtc::EchoControlMobileImpl::StreamProperties,_std::default_delete<webrtc::EchoControlMobileImpl::StreamProperties>_>
               ::operator->(&this->stream_properties_), 16000 < pSVar3->sample_rate_hz)) {
    this_local._4_4_ = -7;
  }
  else {
    if ((enable) && ((this->enabled_ & 1U) == 0)) {
      this->enabled_ = enable;
      this_00 = &this->stream_properties_;
      pSVar3 = std::
               unique_ptr<webrtc::EchoControlMobileImpl::StreamProperties,_std::default_delete<webrtc::EchoControlMobileImpl::StreamProperties>_>
               ::operator->(this_00);
      sample_rate_hz = pSVar3->sample_rate_hz;
      pSVar3 = std::
               unique_ptr<webrtc::EchoControlMobileImpl::StreamProperties,_std::default_delete<webrtc::EchoControlMobileImpl::StreamProperties>_>
               ::operator->(this_00);
      num_reverse_channels = pSVar3->num_reverse_channels;
      pSVar3 = std::
               unique_ptr<webrtc::EchoControlMobileImpl::StreamProperties,_std::default_delete<webrtc::EchoControlMobileImpl::StreamProperties>_>
               ::operator->(this_00);
      Initialize(this,sample_rate_hz,num_reverse_channels,pSVar3->num_output_channels);
    }
    else {
      this->enabled_ = enable;
    }
    this_local._4_4_ = 0;
  }
  rtc::CritScope::~CritScope(&local_30);
  rtc::CritScope::~CritScope(&cs_capture);
  return this_local._4_4_;
}

Assistant:

int EchoControlMobileImpl::Enable(bool enable) {
  // Ensure AEC and AECM are not both enabled.
  rtc::CritScope cs_render(crit_render_);
  rtc::CritScope cs_capture(crit_capture_);
  RTC_DCHECK(stream_properties_);

  if (enable &&
      stream_properties_->sample_rate_hz > AudioProcessing::kSampleRate16kHz) {
    return AudioProcessing::kBadSampleRateError;
  }

  if (enable && !enabled_) {
    enabled_ = enable;  // Must be set before Initialize() is called.

    // TODO(peah): Simplify once the Enable function has been removed from
    // the public APM API.
    Initialize(stream_properties_->sample_rate_hz,
               stream_properties_->num_reverse_channels,
               stream_properties_->num_output_channels);
  } else {
    enabled_ = enable;
  }
  return AudioProcessing::kNoError;
}